

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O2

void __thiscall pstack::Dwarf::Unit::Unit(Unit *this,Info *di,DWARFReader *r)

{
  _Rb_tree_header *p_Var1;
  Off *pOVar2;
  byte bVar3;
  uint16_t uVar4;
  uintmax_t uVar5;
  Exception *this_00;
  Exception *rhs;
  size_t len;
  pair<unsigned_long,_unsigned_long> pVar6;
  Exception local_1d8;
  
  (this->super_enable_shared_from_this<pstack::Dwarf::Unit>)._M_weak_this.
  super___weak_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<pstack::Dwarf::Unit>)._M_weak_this.
  super___weak_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->abbreviations)._M_h._M_buckets = &(this->abbreviations)._M_h._M_single_bucket;
  (this->abbreviations)._M_h._M_bucket_count = 1;
  (this->abbreviations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->abbreviations)._M_h._M_element_count = 0;
  (this->abbreviations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->abbreviations)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->abbreviations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->allEntries)._M_t._M_impl.super__Rb_tree_header;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->macros)._M_t.
  super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>._M_t.
  super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>.
  super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl = (Macros *)0x0;
  p_Var1 = &(this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header;
  this->abbrevOffset = 0;
  (this->lines)._M_t.
  super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>._M_t
  .super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>.
  super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl = (LineInfo *)0x0;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->dwarf = di;
  this->unitType = DW_UT_compile;
  *(undefined8 *)(this->id)._M_elems = 0;
  this->offset = r->off;
  pVar6 = DWARFReader::getlength(r);
  this->length = (uint)pVar6.first;
  this->dwarfLen = pVar6.second;
  this->end = (ulong)(uint)pVar6.first + r->off;
  uVar4 = DWARFReader::getu16(r);
  pOVar2 = &this->abbrevOffset;
  this->version = uVar4;
  if (uVar4 < 3) {
    this->dwarfLen = 8;
    len = 4;
  }
  else {
    if (4 < uVar4) {
      bVar3 = DWARFReader::getu8(r);
      this->unitType = (uint)bVar3;
      if (bVar3 - 4 < 3) {
        bVar3 = DWARFReader::getu8(r);
        this->addrlen = bVar3;
        r->addrLen = (uint)bVar3;
        uVar5 = DWARFReader::getuint(r,this->dwarfLen);
        *pOVar2 = uVar5;
        DWARFReader::getBytes(r,8,(this->id)._M_elems);
      }
      else {
        if (2 < bVar3 - DW_UT_compile) {
          this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
          memset(&local_1d8,0,0x1a0);
          Exception::Exception(&local_1d8);
          std::operator<<((ostream *)&local_1d8.str,"unhandled DW_UT_ unit type value ");
          rhs = Exception::operator<<(&local_1d8,&this->unitType);
          Exception::Exception(this_00,rhs);
          __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
        }
        bVar3 = DWARFReader::getu8(r);
        this->addrlen = bVar3;
        r->addrLen = (uint)bVar3;
        uVar5 = DWARFReader::getuint(r,this->dwarfLen);
        *pOVar2 = uVar5;
      }
      goto LAB_0015ea9e;
    }
    len = this->dwarfLen;
  }
  uVar5 = DWARFReader::getuint(r,len);
  *pOVar2 = uVar5;
  bVar3 = DWARFReader::getu8(r);
  this->addrlen = bVar3;
  r->addrLen = (uint)bVar3;
LAB_0015ea9e:
  this->rootOffset = r->off;
  return;
}

Assistant:

Unit::Unit(const Info *di, DWARFReader &r)
    : abbrevOffset{ 0 }
    , dwarf(di)
    , unitType(DW_UT_compile)
    , id{}
{
    offset = r.getOffset();
    std::tie(length, dwarfLen) = r.getlength();
    end = r.getOffset() + length;
    version = r.getu16();

    if (version <= 2) // DWARF Version 2 uses the architecture's address size.
       dwarfLen = ELF_BYTES;
    if (version >= 5) {
        unitType = UnitType(r.getu8());
        switch (unitType) {
        case DW_UT_compile:
        case DW_UT_type:
        case DW_UT_partial:
            r.addrLen = addrlen = r.getu8();
            abbrevOffset = r.getuint(dwarfLen);
            break;
        case DW_UT_skeleton:
        case DW_UT_split_compile:
        case DW_UT_split_type:
            r.addrLen = addrlen = r.getu8();
            abbrevOffset = r.getuint(dwarfLen);
            r.getBytes(sizeof id, &id[0]);
            break;
        default:
            throw (Exception() << "unhandled DW_UT_ unit type value " << unitType);
        }
    } else {
        abbrevOffset = r.getuint(version <= 2 ? 4 : dwarfLen);
        r.addrLen = addrlen = r.getu8();
    }
    rootOffset = r.getOffset();
    // we now have enough info to parse the abbreviations and the DIE tree.
}